

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

size_t __thiscall luna::Function::AddInstruction(Function *this,Instruction i,int line)

{
  int local_18;
  Instruction local_14;
  
  _local_18 = CONCAT44(i.opcode_,line);
  std::vector<luna::Instruction,_std::allocator<luna::Instruction>_>::push_back
            (&this->opcodes_,&local_14);
  std::vector<int,_std::allocator<int>_>::push_back(&this->opcode_lines_,&local_18);
  return ((long)(this->opcodes_).
                super__Vector_base<luna::Instruction,_std::allocator<luna::Instruction>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->opcodes_).
                super__Vector_base<luna::Instruction,_std::allocator<luna::Instruction>_>._M_impl.
                super__Vector_impl_data._M_start >> 2) - 1;
}

Assistant:

std::size_t Function::AddInstruction(Instruction i, int line)
    {
        opcodes_.push_back(i);
        opcode_lines_.push_back(line);
        return opcodes_.size() - 1;
    }